

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O3

void __thiscall
hungarian_algorithm::HungarianSolver<double,unsigned_long,std::less<double>>::
solve<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
          (HungarianSolver<double,unsigned_long,std::less<double>> *this,
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *cost_function)

{
  char cVar1;
  
  if ((*(long *)this != 0) && (*(long *)(this + 8) != 0)) {
    copyAndNormalizeCosts<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
              (this,cost_function);
    while (cVar1 = hungarian_algorithm::HungarianSolverBase::areAllColumnsCovered(), cVar1 == '\0')
    {
      while (cVar1 = hungarian_algorithm::HungarianSolverBase::findAssignment(), cVar1 == '\0') {
        HungarianSolver<double,_unsigned_long,_std::less<double>_>::subtractSmallestUncoveredElement
                  ((HungarianSolver<double,_unsigned_long,_std::less<double>_> *)this);
      }
    }
  }
  return;
}

Assistant:

void solve(const CostFunction& cost_function)
  {
    if (num_rows_ != 0 && num_cols_ != 0)
    {
      copyAndNormalizeCosts<CostFunction>(cost_function);
      while (!areAllColumnsCovered())
      {
        while (!findAssignment())
        {
          // No zeros found => generate more zeros by subtracting smallest remaining element:
          subtractSmallestUncoveredElement();
        }
      }
    }
  }